

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2.c
# Opt level: O0

size_t ec2SubLD_deep(size_t n,size_t f_deep)

{
  size_t f_deep_00;
  size_t sVar1;
  size_t in_RSI;
  long in_RDI;
  
  f_deep_00 = in_RDI * 0x18;
  sVar1 = ec2AddLD_deep(in_RSI,f_deep_00);
  sVar1 = utilMax(2,in_RSI,sVar1);
  return f_deep_00 + sVar1;
}

Assistant:

static size_t ec2SubLD_deep(size_t n, size_t f_deep)
{
	return O_OF_W(3 * n) +
		utilMax(2,
			f_deep,
			ec2AddLD_deep(n, f_deep));
}